

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::unwind(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *this)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  chunk *pcVar2;
  chunk *pcVar3;
  chunk *pcVar4;
  
  pcVar4 = this->current_chunk_;
  if (pcVar4 != (chunk *)0x0) {
    pcVar3 = pcVar4;
    pcVar2 = pcVar4->back_;
    if (pcVar4->back_ != (chunk *)0x0) {
      do {
        pcVar4 = pcVar2;
        pcVar3->curr_ = pcVar3->begin_;
        pcVar3 = pcVar4;
        pcVar2 = pcVar4->back_;
      } while (pcVar4->back_ != (chunk *)0x0);
      this->current_chunk_ = pcVar4;
    }
    psVar1 = pcVar4->begin_;
    pcVar4->curr_ = psVar1;
    this->curr_ = psVar1;
    this->begin_ = psVar1;
    this->end_ = pcVar4->end_;
  }
  return;
}

Assistant:

void unwind()
    {
        if(this->current_chunk_)
        {
            while(this->current_chunk_->back_)
            {
                this->current_chunk_->curr_ = this->current_chunk_->begin_;
                this->current_chunk_ = this->current_chunk_->back_;
            }

            this->begin_ = this->curr_ = this->current_chunk_->curr_ = this->current_chunk_->begin_;
            this->end_ = this->current_chunk_->end_;
        }
    }